

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_sni_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  ECHConfig *pEVar1;
  int iVar2;
  size_t len;
  _Head_base<0UL,_char_*,_false> data;
  CBB server_name_list;
  CBB name;
  CBB contents;
  CBB local_b0;
  CBB local_80;
  CBB local_50;
  
  if (type == ssl_client_hello_outer) {
    pEVar1 = (hs->selected_ech_config)._M_t.
             super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl;
    data._M_head_impl = (char *)(pEVar1->public_name).data_;
    len = (pEVar1->public_name).size_;
  }
  else {
    data._M_head_impl =
         (hs->ssl->hostname)._M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    if (data._M_head_impl == (char *)0x0) {
      return true;
    }
    len = strlen(data._M_head_impl);
  }
  iVar2 = CBB_add_u16(out,0);
  if (iVar2 == 0) {
    return false;
  }
  iVar2 = CBB_add_u16_length_prefixed(out,&local_50);
  if ((iVar2 != 0) && (iVar2 = CBB_add_u16_length_prefixed(&local_50,&local_b0), iVar2 != 0)) {
    iVar2 = CBB_add_u8(&local_b0,'\0');
    if (iVar2 == 0) {
      return false;
    }
    iVar2 = CBB_add_u16_length_prefixed(&local_b0,&local_80);
    if ((iVar2 != 0) &&
       (iVar2 = CBB_add_bytes(&local_80,(uint8_t *)data._M_head_impl,len), iVar2 != 0)) {
      iVar2 = CBB_flush(out);
      return iVar2 != 0;
    }
  }
  return false;
}

Assistant:

static bool ext_sni_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                    CBB *out_compressible,
                                    ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  // If offering ECH, send the public name instead of the configured name.
  Span<const uint8_t> hostname;
  if (type == ssl_client_hello_outer) {
    hostname = hs->selected_ech_config->public_name;
  } else {
    if (ssl->hostname == nullptr) {
      return true;
    }
    hostname = StringAsBytes(ssl->hostname.get());
  }

  CBB contents, server_name_list, name;
  if (!CBB_add_u16(out, TLSEXT_TYPE_server_name) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &server_name_list) ||
      !CBB_add_u8(&server_name_list, TLSEXT_NAMETYPE_host_name) ||
      !CBB_add_u16_length_prefixed(&server_name_list, &name) ||
      !CBB_add_bytes(&name, hostname.data(), hostname.size()) ||
      !CBB_flush(out)) {
    return false;
  }

  return true;
}